

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:665:9),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:665:9),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  Exception *this_00;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>_>
  depResult;
  ExceptionOrValue local_5f8;
  char local_498;
  ExceptionOrValue local_490;
  char local_330;
  undefined8 *local_2f8;
  long *local_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_490.exception.ptr.isSet = false;
  local_330 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_490);
  uVar5 = local_490.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_490.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_490.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_490.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_490.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_490.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_490.exception.ptr.field_1 + 0x50);
    local_2e8.ownFile.content.disposer =
         local_490.exception.ptr.field_1.value.ownFile.content.disposer;
    local_490.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_490.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_490.exception.ptr.field_1.value.file;
    local_2e8.line = local_490.exception.ptr.field_1.value.line;
    local_2e8.type = local_490.exception.ptr.field_1.value.type;
    local_2e8.description.content.disposer =
         local_490.exception.ptr.field_1.value.description.content.disposer;
    local_490.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_490.exception.ptr.field_1.value.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_490.exception.ptr.field_1.value.context.ptr.disposer;
    local_490.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_188.ownFile.content.disposer =
         local_490.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_188.file = local_490.exception.ptr.field_1.value.file;
    local_188.line = local_490.exception.ptr.field_1.value.line;
    local_188.type = local_490.exception.ptr.field_1.value.type;
    local_188.description.content.disposer =
         local_490.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_490.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_5f8.exception.ptr.isSet = true;
    local_5f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1;
    local_5f8.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_5f8.exception.ptr.field_1.value.ownFile.content.disposer =
         local_490.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_5f8.exception.ptr.field_1.value.file = local_490.exception.ptr.field_1.value.file;
    local_5f8.exception.ptr.field_1._32_8_ = local_490.exception.ptr.field_1._32_8_;
    local_5f8.exception.ptr.field_1.value.description.content.ptr = (char *)uVar3;
    local_5f8.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_5f8.exception.ptr.field_1.value.description.content.disposer =
         local_490.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_5f8.exception.ptr.field_1.value.context.ptr.disposer =
         local_490.exception.ptr.field_1.value.context.ptr.disposer;
    local_5f8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5f8.exception.ptr.field_1 + 0x50),__src,0x104);
    local_498 = '\0';
    Exception::~Exception(&local_188);
    ExceptionOrValue::operator=(output,&local_5f8);
    if (&local_5f8 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_498 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_5f8.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5f8.exception.ptr.field_1.value);
    }
    this_00 = &local_2e8;
  }
  else {
    if (local_330 != '\x01') goto LAB_002e4749;
    *(this->func).returned = true;
    local_5f8.exception.ptr.isSet = false;
    local_498 = '\x01';
    ExceptionOrValue::operator=(output,&local_5f8);
    if (&local_5f8 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_498 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_5f8.exception.ptr.isSet != true) goto LAB_002e4749;
    this_00 = (Exception *)&local_5f8.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_002e4749:
  plVar6 = local_2f0;
  if ((local_330 == '\x01') && (local_2f0 != (long *)0x0)) {
    local_2f0 = (long *)0x0;
    (**(code **)*local_2f8)(local_2f8,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  if (local_490.exception.ptr.isSet == true) {
    Exception::~Exception(&local_490.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }